

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

unique_ptr<Catch::Generators::SingleValueGenerator<unary_op_tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_trng::optimized_impl::uint128>_>,_std::default_delete<Catch::Generators::SingleValueGenerator<unary_op_tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_trng::optimized_impl::uint128>_>_>_>
 __thiscall
Catch::Generators::pf::
make_unique<Catch::Generators::SingleValueGenerator<unary_op_tuple<std::__cxx11::string,trng::optimized_impl::uint128>>,unary_op_tuple<std::__cxx11::string,trng::optimized_impl::uint128>>
          (pf *this,
          unary_op_tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_trng::optimized_impl::uint128>
          *args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 uVar3;
  undefined8 *puVar4;
  
  puVar4 = (undefined8 *)operator_new(0x40);
  *puVar4 = &PTR__SingleValueGenerator_00319bf8;
  puVar4[2] = puVar4 + 4;
  pcVar2 = (args->a)._M_dataplus._M_p;
  paVar1 = &(args->a).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar1) {
    uVar3 = *(undefined8 *)((long)&(args->a).field_2 + 8);
    puVar4[4] = paVar1->_M_allocated_capacity;
    puVar4[5] = uVar3;
  }
  else {
    puVar4[2] = pcVar2;
    puVar4[4] = paVar1->_M_allocated_capacity;
  }
  puVar4[3] = (args->a)._M_string_length;
  (args->a)._M_dataplus._M_p = (pointer)paVar1;
  (args->a)._M_string_length = 0;
  (args->a).field_2._M_local_buf[0] = '\0';
  uVar3 = *(undefined8 *)((long)&(args->y).value + 8);
  puVar4[6] = (long)(args->y).value;
  puVar4[7] = uVar3;
  *(undefined8 **)this = puVar4;
  return (__uniq_ptr_data<Catch::Generators::SingleValueGenerator<unary_op_tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_trng::optimized_impl::uint128>_>,_std::default_delete<Catch::Generators::SingleValueGenerator<unary_op_tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_trng::optimized_impl::uint128>_>_>,_true,_true>
          )(__uniq_ptr_data<Catch::Generators::SingleValueGenerator<unary_op_tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_trng::optimized_impl::uint128>_>,_std::default_delete<Catch::Generators::SingleValueGenerator<unary_op_tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_trng::optimized_impl::uint128>_>_>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> make_unique( Args&&... args ) {
            return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
        }